

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer-test.cc
# Opt level: O2

void __thiscall
Buffer_search_almost_match_at_page_break_Test::~Buffer_search_almost_match_at_page_break_Test
          (Buffer_search_almost_match_at_page_break_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Buffer, search_almost_match_at_page_break) {
    auto constexpr a = std::string_view { "The Beat" };
    auto constexpr b = std::string_view { " were not the same band as T" };
    auto constexpr c = std::string_view { "he Beatles" };

    auto buf = bfy_buffer_init();
    bfy_buffer_add_readonly(&buf, std::data(a), std::size(a));
    bfy_buffer_add_readonly(&buf, std::data(b), std::size(b));
    bfy_buffer_add_readonly(&buf, std::data(c), std::size(c));

    auto constexpr needle = std::string_view { "The Beatles" };
    auto constexpr expected_pos = std::size(a) + std::size(b) - 1;
    auto pos = size_t {};

    EXPECT_EQ(0, bfy_buffer_search_all(&buf, std::data(needle), std::size(needle), &pos));
    EXPECT_EQ(expected_pos, pos);

    bfy_buffer_destruct(&buf);
}